

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpInst *i)

{
  char cVar1;
  bool bVar2;
  bool reversed;
  Value *v;
  Value *v_00;
  ConditionCode CStack_160;
  _Head_base<0UL,_arm::Inst_*,_false> local_150;
  uint local_144;
  _Head_base<0UL,_arm::Arith2Inst_*,_false> local_140;
  undefined1 local_138 [4];
  undefined1 local_134 [36];
  VarId local_110;
  VarId local_100;
  VarId local_f0;
  VarId local_e0;
  VarId local_d0;
  VarId local_c0;
  VarId local_b0;
  VarId local_a0;
  VarId local_90;
  VarId local_80;
  VarId local_70;
  VarId local_60;
  VarId local_50;
  VarId local_40;
  
  cVar1 = (i->rhs).field_0x18;
  if ((i->lhs).field_0x18 == '\0') {
    if (cVar1 != '\0') goto LAB_00152bc8;
LAB_00152bee:
    reversed = false;
    v = &i->rhs;
    v_00 = &i->lhs;
  }
  else {
    if (((cVar1 == '\0') || ((i->lhs).shift_amount == '\0')) || ((i->rhs).shift_amount != '\0'))
    goto LAB_00152bee;
LAB_00152bc8:
    bVar2 = can_reverse_param(i->op);
    v_00 = &i->rhs;
    reversed = true;
    v = &i->lhs;
    if (!bVar2) goto LAB_00152bee;
  }
  switch(i->op) {
  case Add:
    local_144 = 9;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_40.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_40);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Sub:
    if (reversed == false) {
      local_144 = 10;
      local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_60.id = (i->super_Inst).dest.id;
      local_138 = (undefined1  [4])translate_var_reg(this,&local_60);
      local_134._0_4_ = translate_value_to_reg(this,v_00);
      translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
                ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
      local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
      local_140._M_head_impl = (Arith2Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150
                );
    }
    else {
      local_144 = 0xb;
      local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
      local_50.id = (i->super_Inst).dest.id;
      local_138 = (undefined1  [4])translate_var_reg(this,&local_50);
      local_134._0_4_ = translate_value_to_reg(this,v_00);
      translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
      std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
                ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
      local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
      local_140._M_head_impl = (Arith2Inst *)0x0;
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150
                );
    }
    break;
  case Mul:
    local_144 = 0xc;
    local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_70.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_70);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    local_134._12_4_ = translate_value_to_reg(this,v);
    local_134._4_8_ = &PTR_display_001db7d0;
    local_134._16_2_ = 1;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(RegisterOperand *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Div:
    local_144 = 0x10;
    local_90.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_90.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_90);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    local_134._12_4_ = translate_value_to_reg(this,v);
    local_134._4_8_ = &PTR_display_001db7d0;
    local_134._16_2_ = 1;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(RegisterOperand *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case MulSh:
    local_144 = 0xd;
    local_80.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_80.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_80);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    local_134._12_4_ = translate_value_to_reg(this,v);
    local_134._4_8_ = &PTR_display_001db7d0;
    local_134._16_2_ = 1;
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::RegisterOperand>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(RegisterOperand *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Rem:
    local_144 = 0x22;
    local_110.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_110.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_110);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Gt:
    CStack_160 = Gt;
    goto LAB_00153466;
  case Lt:
    CStack_160 = Lt;
    goto LAB_00153466;
  case Gte:
    CStack_160 = Ge;
    goto LAB_00153466;
  case Lte:
    CStack_160 = Le;
    goto LAB_00153466;
  case Eq:
    CStack_160 = Equal;
    goto LAB_00153466;
  case Neq:
    CStack_160 = NotEqual;
LAB_00153466:
    emit_compare(this,&(i->super_Inst).dest,v_00,v,CStack_160,reversed);
    return;
  case And:
    local_144 = 0x11;
    local_a0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_a0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_a0);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Or:
    local_144 = 0x12;
    local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_b0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_b0);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Xor:
    local_144 = 0x13;
    local_c0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_c0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_c0);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Not:
    local_144 = 8;
    local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_d0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_d0);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v_00);
    std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(Operand2 *)local_138);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    if ((Arith2Inst *)local_150._M_head_impl != (Arith2Inst *)0x0) {
      (*(((Inst *)&(local_150._M_head_impl)->super_Displayable)->super_Displayable).
        _vptr_Displayable[2])();
    }
    local_150._M_head_impl = (Inst *)0x0;
    std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)&local_140);
    return;
  case Shl:
    local_144 = 0x15;
    local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_e0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_e0);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case Shr:
    local_144 = 0x16;
    local_f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_f0.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_f0);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  case ShrA:
    local_144 = 0x17;
    local_100.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_100.id = (i->super_Inst).dest.id;
    local_138 = (undefined1  [4])translate_var_reg(this,&local_100);
    local_134._0_4_ = translate_value_to_reg(this,v_00);
    translate_value_to_operand2((Operand2 *)(local_134 + 4),this,v);
    std::make_unique<arm::Arith3Inst,arm::OpCode,unsigned_int,unsigned_int,arm::Operand2>
              ((OpCode *)&local_140,&local_144,(uint *)local_138,(Operand2 *)local_134);
    local_150._M_head_impl = &(local_140._M_head_impl)->super_Inst;
    local_140._M_head_impl = (Arith2Inst *)0x0;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_150);
    break;
  default:
    goto switchD_00152c10_default;
  }
  if ((Arith2Inst *)local_150._M_head_impl != (Arith2Inst *)0x0) {
    (*(((Inst *)&(local_150._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [2])();
  }
  local_150._M_head_impl = (Inst *)0x0;
  std::unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith3Inst,_std::default_delete<arm::Arith3Inst>_> *)&local_140);
switchD_00152c10_default:
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpInst& i) {
  // Reverse when:
  //  - lhs is immediate
  //  - lhs is variable with shift and rhs is regular variable
  bool reverse_params = ((i.lhs.is_immediate() && !i.rhs.is_immediate()) ||
                         (!i.lhs.is_immediate() && !i.rhs.is_immediate() &&
                          i.lhs.has_shift() && !i.rhs.has_shift())) &&
                        can_reverse_param(i.op);

  mir::inst::Value& lhs = reverse_params ? i.rhs : i.lhs;
  mir::inst::Value& rhs = reverse_params ? i.lhs : i.rhs;

  switch (i.op) {
    case mir::inst::Op::Add:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Add, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Sub:
      if (reverse_params) {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Rsb, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      } else {
        inst.push_back(std::make_unique<Arith3Inst>(
            arm::OpCode::Sub, translate_var_reg(i.dest),
            translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      }
      break;

    case mir::inst::Op::Mul:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Mul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::MulSh:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SMMul, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::Div:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::SDiv, translate_var_reg(i.dest),
          translate_value_to_reg(lhs),
          RegisterOperand(translate_value_to_reg(rhs))));
      break;

    case mir::inst::Op::And:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::And, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Or:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Orr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Xor:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Eor, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Not:
      inst.push_back(std::make_unique<Arith2Inst>(
          arm::OpCode::Mvn, translate_var_reg(i.dest),
          translate_value_to_operand2(lhs)));
      break;

    case mir::inst::Op::Shl:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsl, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Shr:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Lsr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::ShrA:
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::Asr, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;

    case mir::inst::Op::Rem:
      // WARN: Mod is a pseudo-instruction!
      // Mod operations needs to be eliminated in later passes.
      inst.push_back(std::make_unique<Arith3Inst>(
          arm::OpCode::_Mod, translate_var_reg(i.dest),
          translate_value_to_reg(lhs), translate_value_to_operand2(rhs)));
      break;
    case mir::inst::Op::Gt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Gt, reverse_params);
      break;
    case mir::inst::Op::Lt:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Lt, reverse_params);
      break;
    case mir::inst::Op::Gte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Ge, reverse_params);
      break;
    case mir::inst::Op::Lte:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Le, reverse_params);
      break;
    case mir::inst::Op::Eq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::Equal, reverse_params);
      break;
    case mir::inst::Op::Neq:
      emit_compare(i.dest, lhs, rhs, ConditionCode::NotEqual, reverse_params);
      break;
  }
}